

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simultan.c
# Opt level: O2

int in_solvefor(Symbol *s)

{
  List *pLVar1;
  
  pLVar1 = solveforlist;
  if (solveforlist != (List *)0x0) {
    do {
      pLVar1 = pLVar1->next;
      if (pLVar1 == solveforlist) {
        return 0;
      }
    } while ((Symbol *)(pLVar1->element).itm != s);
  }
  return 1;
}

Assistant:

int in_solvefor(s)
	Symbol *s;
{
	Item *q;
	
	if (!solveforlist) {
		return 1;
	}
	ITERATE(q, solveforlist) {
		if (s == SYM(q)) {
			return 1;
		}
	}
	return 0;
}